

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
::_container_insert(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
                    *this,Column *column,Index pos)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  local_50;
  Index local_1c;
  Column *pCStack_18;
  Index pos_local;
  Column *column_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  *this_local;
  
  local_1c = pos;
  pCStack_18 = column;
  column_local = (Column *)this;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  ::Intrusive_list_column(&local_50,column,this->colSettings_);
  std::
  unordered_map<unsigned_int,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>>>>
  ::
  try_emplace<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>>
            ((unordered_map<unsigned_int,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>>>>
              *)&this->matrix_,&local_1c,&local_50);
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  ::~Intrusive_list_column(&local_50);
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_container_insert(const Column& column, [[maybe_unused]] Index pos)
{
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.try_emplace(pos, Column(column, column.get_column_index(), RA_opt::rows_, colSettings_));
    } else {
      matrix_.try_emplace(pos, Column(column, colSettings_));
    }
  } else {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.emplace_back(column, column.get_column_index(), RA_opt::rows_, colSettings_);
    } else {
      matrix_.emplace_back(column, colSettings_);
    }
  }
}